

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ValueDriver * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::ValueExpressionBase_const&,slang::ast::Symbol_const&,slang::bitmask<slang::ast::AssignFlags>&>
          (BumpAllocator *this,DriverKind *args,ValueExpressionBase *args_1,Symbol *args_2,
          bitmask<slang::ast::AssignFlags> *args_3)

{
  ValueDriver *this_00;
  
  this_00 = (ValueDriver *)allocate(this,0x20,8);
  ast::ValueDriver::ValueDriver
            (this_00,*args,&args_1->super_Expression,args_2,
             (bitmask<slang::ast::AssignFlags>)args_3->m_bits);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }